

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O1

void __thiscall glslang::TReflection::~TReflection(TReflection *this)

{
  pointer piVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  this->_vptr_TReflection = (_func_int **)&PTR__TReflection_00b08e20;
  piVar1 = (this->atomicCounterUniformIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->atomicCounterUniformIndices).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToPipeOutput);
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToPipeInput);
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToBufferBlock);
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToBufferVariable);
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToUniformBlock);
  std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::~vector
            (&this->indexToUniform);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::_M_erase(&(this->pipeOutNameToIndex)._M_t,
             (_Link_type)
             (this->pipeOutNameToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::_M_erase(&(this->pipeInNameToIndex)._M_t,
             (_Link_type)
             (this->pipeInNameToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::_M_erase(&(this->nameToIndex)._M_t,
             (_Link_type)(this->nameToIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
  ;
  pcVar2 = (this->badReflection).name._M_dataplus._M_p;
  paVar3 = &(this->badReflection).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~TReflection() {}